

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O2

void __thiscall
libnbt::NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::NBTTagData(NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this)

{
  (this->super_NBTBase).type = '\0';
  (this->super_NBTBase)._vptr_NBTBase = (_func_int **)&PTR_read_00111b60;
  (this->_data)._M_dataplus._M_p = (pointer)&(this->_data).field_2;
  (this->_data)._M_string_length = 0;
  (this->_data).field_2._M_local_buf[0] = '\0';
  setType(this);
  return;
}

Assistant:

NBTTagData() { setType(); }